

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O1

void wallet::wallet_tests::PollutePubKey(CPubKey *pubkey)

{
  byte bVar1;
  bool bVar2;
  size_type __n;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_raw;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  CPubKey local_59;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = pubkey->vch[0];
  if ((((bVar1 & 0xfe) != 2) && (1 < bVar1 - 6)) && (bVar1 != 4)) {
    __assert_fail("pubkey.size() >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                  ,0x218,"void wallet::wallet_tests::PollutePubKey(CPubKey &)");
  }
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_realloc_insert<unsigned_char_const&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_78,(iterator)0x0,
             pubkey->vch);
  __n = 0x20;
  if ((pubkey->vch[0] & 0xfe) != 2) {
    bVar1 = pubkey->vch[0] - 4;
    __n = 0xffffffff;
    if (bVar1 < 4) {
      __n = *(size_type *)(&DAT_00f88648 + (ulong)bVar1 * 8);
    }
  }
  local_59.vch[0] = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
            (&local_78,
             (iterator)
             local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,__n,local_59.vch);
  CPubKey::Set<unsigned_char_const*>
            (&local_59,
             local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  memcpy(pubkey,&local_59,0x41);
  bVar2 = CPubKey::IsFullyValid(pubkey);
  if (bVar2) {
    __assert_fail("!pubkey.IsFullyValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                  ,0x21d,"void wallet::wallet_tests::PollutePubKey(CPubKey &)");
  }
  bVar1 = pubkey->vch[0];
  if ((((bVar1 & 0xfe) != 2) && (1 < bVar1 - 6)) && (bVar1 != 4)) {
    __assert_fail("pubkey.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                  ,0x21e,"void wallet::wallet_tests::PollutePubKey(CPubKey &)");
  }
  if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void PollutePubKey(CPubKey& pubkey)
{
    assert(pubkey.size() >= 1);
    std::vector<unsigned char> pubkey_raw;
    pubkey_raw.push_back(pubkey[0]);
    pubkey_raw.insert(pubkey_raw.end(), pubkey.size() - 1, 0);
    pubkey = CPubKey(pubkey_raw);
    assert(!pubkey.IsFullyValid());
    assert(pubkey.IsValid());
}